

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmxmdp.hpp
# Opt level: O3

type setMDPenum<GMXMDP::PullGeom>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom>_>_>
                *str2enum,string *str,PullGeom *optval)

{
  const_iterator cVar1;
  MDP_Exception *this;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullGeom>_>_>
          ::find(&str2enum->_M_t,str);
  if ((_Rb_tree_header *)cVar1._M_node != &(str2enum->_M_t)._M_impl.super__Rb_tree_header) {
    *optval = cVar1._M_node[2]._M_color;
    return;
  }
  this = (MDP_Exception *)__cxa_allocate_exception(0x28);
  std::operator+(&local_68,"Can\'t find enum for string: \'",str);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_48._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_48._M_dataplus._M_p == psVar3) {
    local_48.field_2._M_allocated_capacity = *psVar3;
    local_48.field_2._8_8_ = plVar2[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar3;
  }
  local_48._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  MDP_Exception::MDP_Exception(this,&local_48);
  __cxa_throw(this,&MDP_Exception::typeinfo,General_Exception::~General_Exception);
}

Assistant:

typename enable_if<std::is_enum<T>::value, void>::type
setMDPenum(const map<string, T>& str2enum, const string& str, T& optval) {
  const typename map<string,T>::const_iterator it = str2enum.find(str);
  if(it == str2enum.end()) {
    throw(MDP_Exception("Can't find enum for string: '"+str+"'"));
  }
  optval = it->second;
}